

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# element.cpp
# Opt level: O1

bool __thiscall IntElemBoundsImp<0,_4,_0>::propagate(IntElemBoundsImp<0,_4,_0> *this)

{
  long lVar1;
  char cVar2;
  char cVar3;
  uint uVar4;
  int iVar5;
  IntView<0> *pIVar6;
  IntVar *pIVar7;
  IntVar *pIVar8;
  byte bVar9;
  int iVar10;
  int iVar11;
  Reason RVar12;
  Clause *pCVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  Lit p;
  IntView<0> *pIVar18;
  long lVar19;
  int64_t m_v;
  bool bVar20;
  ulong uVar21;
  anon_union_8_2_743a5d44_for_Reason_0 aVar22;
  anon_union_8_2_743a5d44_for_Reason_0 aVar23;
  bool bVar24;
  byte bVar25;
  initializer_list<Lit> __l;
  initializer_list<Lit> __l_00;
  initializer_list<Lit> __l_01;
  initializer_list<Lit> __l_02;
  initializer_list<Lit> __l_03;
  initializer_list<Lit> __l_04;
  initializer_list<Lit> __l_05;
  initializer_list<Lit> __l_06;
  Clause *c;
  vector<Lit,_std::allocator<Lit>_> expl;
  allocator_type local_131;
  anon_union_8_2_743a5d44_for_Reason_0 local_130;
  vector<Lit,_std::allocator<Lit>_> local_128;
  IntView<0> *local_110;
  vector<Lit,_std::allocator<Lit>_> local_108;
  vector<Lit,_std::allocator<Lit>_> local_f0;
  vector<Lit,_std::allocator<Lit>_> local_d8;
  vector<Lit,_std::allocator<Lit>_> local_c0;
  vector<Lit,_std::allocator<Lit>_> local_a8;
  vector<Lit,_std::allocator<Lit>_> local_90;
  vector<Lit,_std::allocator<Lit>_> local_78;
  vector<Lit,_std::allocator<Lit>_> local_60;
  vector<Lit,_std::allocator<Lit>_> local_48;
  
  uVar17 = (this->b).v;
  cVar2 = sat.assigns.data[uVar17];
  if ((cVar2 == 0) || ((uint)(this->b).s * 2 + -1 != (int)cVar2)) {
    cVar3 = (this->is_fixed).v;
    if (cVar3 != '\0') {
      iVar11 = (this->fixed_index).v;
      if ((iVar11 < 0) || ((int)(this->a).sz <= iVar11)) {
        iVar11 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[10])();
        aVar22._pt = (Clause *)((long)iVar11 * 4 + 2);
        p.x = ((this->b).s ^ 1) + (this->b).v * 2;
LAB_001a450c:
        SAT::cEnqueue(&sat,p,(Reason)aVar22);
        bVar25 = sat.confl == (Clause *)0x0;
        goto LAB_001a4f2c;
      }
      if (cVar3 == '\0') goto LAB_001a4163;
      uVar4 = (this->fixed_index).v;
      pIVar6 = (this->a).data;
      pIVar18 = pIVar6 + uVar4;
      pIVar7 = pIVar6[uVar4].var;
      iVar11 = (pIVar7->min).v;
      if (cVar2 == '\0') {
        pIVar8 = (this->y).var;
        if ((pIVar8->max).v < iVar11) {
          iVar11 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[10])();
          local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)CONCAT44(local_128.super__Vector_base<Lit,_std::allocator<Lit>_>.
                                       _M_impl.super__Vector_impl_data._M_start._4_4_,iVar11);
          iVar11 = (*(pIVar18->var->super_Var).super_Branching._vptr_Branching[8])();
          local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)CONCAT44(iVar11,local_128.
                                              super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                                              super__Vector_impl_data._M_start._0_4_);
          iVar11 = (*(((this->y).var)->super_Var).super_Branching._vptr_Branching[9])();
          local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)CONCAT44(local_128.super__Vector_base<Lit,_std::allocator<Lit>_>.
                                        _M_impl.super__Vector_impl_data._M_finish._4_4_,iVar11);
          __l_02._M_len = 3;
          __l_02._M_array = (iterator)&local_128;
          std::vector<Lit,_std::allocator<Lit>_>::vector(&local_a8,__l_02,&local_131);
          iVar11 = (int)((ulong)((long)local_a8.super__Vector_base<Lit,_std::allocator<Lit>_>.
                                       _M_impl.super__Vector_impl_data._M_finish -
                                (long)local_a8.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl
                                      .super__Vector_impl_data._M_start) >> 2) + 1;
          local_130._pt = (Clause *)malloc((long)iVar11 * 4 + 8);
          *(uint *)local_130._pt = (*(uint *)local_130._pt & 0xfc) + iVar11 * 0x100 + 2;
          vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),&local_130._pt);
          if ((long)local_a8.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_a8.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                    super__Vector_impl_data._M_start != 0) {
            lVar14 = (long)local_a8.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)local_a8.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                           super__Vector_impl_data._M_start >> 2;
            uVar15 = 1;
            do {
              if (*(uint *)local_130._pt >> 8 <= uVar15) goto LAB_001a5151;
              (local_130._pt)->data[uVar15].x =
                   local_a8.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar15 - 1].x;
              lVar19 = (-(ulong)(lVar14 == 0) - lVar14) + uVar15;
              uVar15 = uVar15 + 1;
            } while (lVar19 != 0);
          }
        }
        else {
          bVar25 = 1;
          if ((pIVar8->min).v <= (pIVar7->max).v) goto LAB_001a4f2c;
          iVar11 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[10])();
          local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)CONCAT44(local_128.super__Vector_base<Lit,_std::allocator<Lit>_>.
                                       _M_impl.super__Vector_impl_data._M_start._4_4_,iVar11);
          iVar11 = (*(pIVar18->var->super_Var).super_Branching._vptr_Branching[9])();
          local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)CONCAT44(iVar11,local_128.
                                              super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                                              super__Vector_impl_data._M_start._0_4_);
          iVar11 = (*(((this->y).var)->super_Var).super_Branching._vptr_Branching[8])();
          local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)CONCAT44(local_128.super__Vector_base<Lit,_std::allocator<Lit>_>.
                                        _M_impl.super__Vector_impl_data._M_finish._4_4_,iVar11);
          __l_03._M_len = 3;
          __l_03._M_array = (iterator)&local_128;
          std::vector<Lit,_std::allocator<Lit>_>::vector(&local_c0,__l_03,&local_131);
          iVar11 = (int)((ulong)((long)local_c0.super__Vector_base<Lit,_std::allocator<Lit>_>.
                                       _M_impl.super__Vector_impl_data._M_finish -
                                (long)local_c0.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl
                                      .super__Vector_impl_data._M_start) >> 2) + 1;
          local_130._pt = (Clause *)malloc((long)iVar11 * 4 + 8);
          *(uint *)local_130._pt = (*(uint *)local_130._pt & 0xfc) + iVar11 * 0x100 + 2;
          vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),&local_130._pt);
          local_a8.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
          _M_start = local_c0.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                     super__Vector_impl_data._M_start;
          if ((long)local_c0.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_c0.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                    super__Vector_impl_data._M_start != 0) {
            lVar14 = (long)local_c0.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)local_c0.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                           super__Vector_impl_data._M_start >> 2;
            uVar15 = 1;
            do {
              if (*(uint *)local_130._pt >> 8 <= uVar15) goto LAB_001a5151;
              (local_130._pt)->data[uVar15].x =
                   local_c0.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar15 - 1].x;
              lVar19 = (-(ulong)(lVar14 == 0) - lVar14) + uVar15;
              uVar15 = uVar15 + 1;
            } while (lVar19 != 0);
          }
        }
        aVar22 = local_130;
        if (local_a8.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0) {
          operator_delete(local_a8.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        p.x = ((this->b).s ^ 1) + (this->b).v * 2;
        goto LAB_001a450c;
      }
      if ((((this->y).var)->min).v < iVar11) {
        if (so.lazy) {
          local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)CONCAT44(local_128.super__Vector_base<Lit,_std::allocator<Lit>_>.
                                       _M_impl.super__Vector_impl_data._M_start._4_4_,
                                       (uint)((int)sat.assigns.data[uVar17] - 1U < 0xfffffffd) +
                                       uVar17 * 2);
          iVar10 = (*(pIVar18->var->super_Var).super_Branching._vptr_Branching[8])();
          local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)CONCAT44(iVar10,local_128.
                                              super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                                              super__Vector_impl_data._M_start._0_4_);
          iVar10 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[10])();
          local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)CONCAT44(local_128.super__Vector_base<Lit,_std::allocator<Lit>_>.
                                        _M_impl.super__Vector_impl_data._M_finish._4_4_,iVar10);
          __l._M_len = 3;
          __l._M_array = (iterator)&local_128;
          std::vector<Lit,_std::allocator<Lit>_>::vector(&local_48,__l,&local_131);
          iVar10 = (int)((ulong)((long)local_48.super__Vector_base<Lit,_std::allocator<Lit>_>.
                                       _M_impl.super__Vector_impl_data._M_finish -
                                (long)local_48.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl
                                      .super__Vector_impl_data._M_start) >> 2) + 1;
          local_130._pt = (Clause *)malloc((long)iVar10 * 4 + 8);
          *(uint *)local_130._pt = (*(uint *)local_130._pt & 0xfc) + iVar10 * 0x100 + 2;
          vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),&local_130._pt);
          aVar22 = local_130;
          if ((long)local_48.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_48.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                    super__Vector_impl_data._M_start != 0) {
            lVar14 = (long)local_48.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)local_48.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                           super__Vector_impl_data._M_start >> 2;
            uVar15 = 1;
            do {
              if (*(uint *)local_130._pt >> 8 <= uVar15) goto LAB_001a5151;
              (local_130._pt)->data[uVar15].x =
                   local_48.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar15 - 1].x;
              lVar19 = (-(ulong)(lVar14 == 0) - lVar14) + uVar15;
              uVar15 = uVar15 + 1;
            } while (lVar19 != 0);
          }
          if (local_48.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data
              ._M_start != (pointer)0x0) {
            operator_delete(local_48.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
        }
        else {
          aVar22._pt = (Clause *)0x0;
        }
        pIVar7 = (this->y).var;
        iVar11 = (*(pIVar7->super_Var).super_Branching._vptr_Branching[0xe])
                           (pIVar7,(long)iVar11,aVar22._pt,1);
        if ((char)iVar11 != '\0') goto LAB_001a4d73;
LAB_001a514a:
        bVar25 = 0;
      }
      else {
LAB_001a4d73:
        pIVar7 = (this->y).var;
        iVar11 = (pIVar7->min).v;
        if ((pIVar18->var->min).v < iVar11) {
          if (so.lazy == true) {
            uVar17 = (this->b).v;
            local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
            _M_start = (pointer)CONCAT44(local_128.super__Vector_base<Lit,_std::allocator<Lit>_>.
                                         _M_impl.super__Vector_impl_data._M_start._4_4_,
                                         (uint)((int)sat.assigns.data[uVar17] - 1U < 0xfffffffd) +
                                         uVar17 * 2);
            local_110 = pIVar18;
            iVar10 = (*(pIVar7->super_Var).super_Branching._vptr_Branching[8])();
            local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
            _M_start = (pointer)CONCAT44(iVar10,local_128.
                                                super__Vector_base<Lit,_std::allocator<Lit>_>.
                                                _M_impl.super__Vector_impl_data._M_start._0_4_);
            iVar10 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[10])();
            local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
            _M_finish = (pointer)CONCAT44(local_128.super__Vector_base<Lit,_std::allocator<Lit>_>.
                                          _M_impl.super__Vector_impl_data._M_finish._4_4_,iVar10);
            __l_04._M_len = 3;
            __l_04._M_array = (iterator)&local_128;
            std::vector<Lit,_std::allocator<Lit>_>::vector(&local_60,__l_04,&local_131);
            iVar10 = (int)((ulong)((long)local_60.super__Vector_base<Lit,_std::allocator<Lit>_>.
                                         _M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_60.super__Vector_base<Lit,_std::allocator<Lit>_>.
                                        _M_impl.super__Vector_impl_data._M_start) >> 2) + 1;
            local_130._pt = (Clause *)malloc((long)iVar10 * 4 + 8);
            *(uint *)local_130._pt = (*(uint *)local_130._pt & 0xfc) + iVar10 * 0x100 + 2;
            vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),&local_130._pt);
            pIVar18 = local_110;
            aVar22 = local_130;
            if ((long)local_60.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_60.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                      super__Vector_impl_data._M_start != 0) {
              lVar14 = (long)local_60.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)local_60.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                             super__Vector_impl_data._M_start >> 2;
              uVar15 = 1;
              do {
                if (*(uint *)local_130._pt >> 8 <= uVar15) goto LAB_001a5151;
                (local_130._pt)->data[uVar15].x =
                     local_60.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar15 - 1].x;
                lVar19 = (-(ulong)(lVar14 == 0) - lVar14) + uVar15;
                uVar15 = uVar15 + 1;
              } while (lVar19 != 0);
            }
            if (local_60.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_60.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                              super__Vector_impl_data._M_start);
            }
          }
          else {
            aVar22._pt = (Clause *)0x0;
          }
          iVar11 = (*(pIVar18->var->super_Var).super_Branching._vptr_Branching[0xe])
                             (pIVar18->var,(long)iVar11,aVar22._pt,1);
          if ((char)iVar11 == '\0') goto LAB_001a514a;
        }
        iVar11 = (pIVar18->var->max).v;
        if (iVar11 < (((this->y).var)->max).v) {
          if (so.lazy == true) {
            uVar17 = (this->b).v;
            local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
            _M_start = (pointer)CONCAT44(local_128.super__Vector_base<Lit,_std::allocator<Lit>_>.
                                         _M_impl.super__Vector_impl_data._M_start._4_4_,
                                         (uint)((int)sat.assigns.data[uVar17] - 1U < 0xfffffffd) +
                                         uVar17 * 2);
            iVar10 = (*(pIVar18->var->super_Var).super_Branching._vptr_Branching[9])();
            local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
            _M_start = (pointer)CONCAT44(iVar10,local_128.
                                                super__Vector_base<Lit,_std::allocator<Lit>_>.
                                                _M_impl.super__Vector_impl_data._M_start._0_4_);
            iVar10 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[10])();
            local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
            _M_finish = (pointer)CONCAT44(local_128.super__Vector_base<Lit,_std::allocator<Lit>_>.
                                          _M_impl.super__Vector_impl_data._M_finish._4_4_,iVar10);
            __l_05._M_len = 3;
            __l_05._M_array = (iterator)&local_128;
            std::vector<Lit,_std::allocator<Lit>_>::vector
                      (&local_78,__l_05,(allocator_type *)&local_130);
            pCVar13 = Reason_new(&local_78);
            if (local_78.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_78.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                              super__Vector_impl_data._M_start);
            }
          }
          else {
            pCVar13 = (Clause *)0x0;
          }
          pIVar7 = (this->y).var;
          iVar11 = (*(pIVar7->super_Var).super_Branching._vptr_Branching[0xf])
                             (pIVar7,(long)iVar11,pCVar13,1);
          if ((char)iVar11 == '\0') goto LAB_001a514a;
        }
        pIVar7 = (this->y).var;
        iVar11 = (pIVar7->max).v;
        if (iVar11 < (pIVar18->var->max).v) {
          if (so.lazy == true) {
            uVar17 = (this->b).v;
            local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
            _M_start = (pointer)CONCAT44(local_128.super__Vector_base<Lit,_std::allocator<Lit>_>.
                                         _M_impl.super__Vector_impl_data._M_start._4_4_,
                                         (uint)((int)sat.assigns.data[uVar17] - 1U < 0xfffffffd) +
                                         uVar17 * 2);
            iVar10 = (*(pIVar7->super_Var).super_Branching._vptr_Branching[9])();
            local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
            _M_start = (pointer)CONCAT44(iVar10,local_128.
                                                super__Vector_base<Lit,_std::allocator<Lit>_>.
                                                _M_impl.super__Vector_impl_data._M_start._0_4_);
            iVar10 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[10])();
            local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
            _M_finish = (pointer)CONCAT44(local_128.super__Vector_base<Lit,_std::allocator<Lit>_>.
                                          _M_impl.super__Vector_impl_data._M_finish._4_4_,iVar10);
            __l_06._M_len = 3;
            __l_06._M_array = (iterator)&local_128;
            std::vector<Lit,_std::allocator<Lit>_>::vector
                      (&local_90,__l_06,(allocator_type *)&local_130);
            pCVar13 = Reason_new(&local_90);
            if (local_90.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_90.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                              super__Vector_impl_data._M_start);
            }
          }
          else {
            pCVar13 = (Clause *)0x0;
          }
          iVar11 = (*(pIVar18->var->super_Var).super_Branching._vptr_Branching[0xf])
                             (pIVar18->var,(long)iVar11,pCVar13,1);
          if ((char)iVar11 == '\0') goto LAB_001a514a;
        }
        pIVar7 = (this->y).var;
        bVar25 = 1;
        if (((pIVar7->min).v == (pIVar7->max).v) && ((pIVar18->var->min).v == (pIVar18->var->max).v)
           ) {
          local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)&(this->super_Propagator).satisfied;
          local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)CONCAT44(1,(int)(this->super_Propagator).satisfied.v);
          vec<TrailElem>::push(&engine.trail,(TrailElem *)&local_128);
          (this->super_Propagator).satisfied.v = '\x01';
        }
      }
      goto LAB_001a4f2c;
    }
LAB_001a4163:
    if (cVar2 == '\0') {
      local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (Lit *)0x0;
      bVar20 = false;
      bVar24 = false;
      uVar15 = 0;
      do {
        lVar14 = uVar15 - (long)(this->x).b;
        pIVar7 = (this->x).var;
        if (((lVar14 < (pIVar7->min).v) || ((pIVar7->max).v < lVar14)) ||
           ((pIVar7->vals != (Tchar *)0x0 && (pIVar7->vals[lVar14].v == '\0')))) {
          iVar11 = (*(pIVar7->super_Var).super_Branching._vptr_Branching[0xd])(pIVar7,lVar14,1);
          local_130._a._0_4_ = iVar11;
          if (local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) goto LAB_001a4686;
          std::vector<Lit,_std::allocator<Lit>_>::_M_realloc_insert<Lit>
                    (&local_128,
                     (iterator)
                     local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                     super__Vector_impl_data._M_finish,(Lit *)&local_130);
        }
        else {
          pIVar7 = (this->y).var;
          pIVar8 = (this->a).data[uVar15].var;
          if ((pIVar7->max).v < (pIVar8->min).v) {
            if (!bVar24) {
              iVar11 = (*(pIVar7->super_Var).super_Branching._vptr_Branching[9])();
              local_130._a._0_4_ = iVar11;
              if (local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<Lit,_std::allocator<Lit>_>::_M_realloc_insert<Lit>
                          (&local_128,
                           (iterator)
                           local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                           super__Vector_impl_data._M_finish,(Lit *)&local_130);
              }
              else {
                (local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                 super__Vector_impl_data._M_finish)->x = iVar11;
                local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
              }
              bVar24 = true;
            }
            iVar11 = (*(((this->a).data[uVar15].var)->super_Var).super_Branching._vptr_Branching[8])
                               ();
            local_130._a._0_4_ = iVar11;
            if (local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<Lit,_std::allocator<Lit>_>::_M_realloc_insert<Lit>
                        (&local_128,
                         (iterator)
                         local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                         super__Vector_impl_data._M_finish,(Lit *)&local_130);
            }
            else {
LAB_001a4686:
              (local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
               super__Vector_impl_data._M_finish)->x = iVar11;
              local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
          }
          else {
            if ((pIVar7->min).v <= (pIVar8->max).v) break;
            if (!bVar20) {
              iVar11 = (*(pIVar7->super_Var).super_Branching._vptr_Branching[8])();
              local_130._a._0_4_ = iVar11;
              if (local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<Lit,_std::allocator<Lit>_>::_M_realloc_insert<Lit>
                          (&local_128,
                           (iterator)
                           local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                           super__Vector_impl_data._M_finish,(Lit *)&local_130);
              }
              else {
                (local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                 super__Vector_impl_data._M_finish)->x = iVar11;
                local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
              }
              bVar20 = true;
            }
            iVar11 = (*(((this->a).data[uVar15].var)->super_Var).super_Branching._vptr_Branching[9])
                               ();
            local_130._a._0_4_ = iVar11;
            if (local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                super__Vector_impl_data._M_finish !=
                local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) goto LAB_001a4686;
            std::vector<Lit,_std::allocator<Lit>_>::_M_realloc_insert<Lit>
                      (&local_128,
                       (iterator)
                       local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                       super__Vector_impl_data._M_finish,(Lit *)&local_130);
          }
        }
        uVar17 = (int)uVar15 + 1;
        uVar15 = (ulong)uVar17;
      } while (uVar17 <= (this->a).sz);
      lVar14 = (long)(this->x).b + (long)(((this->x).var)->max).v;
      uVar16 = uVar15;
      if (lVar14 < (long)uVar15) {
        std::vector<Lit,_std::allocator<Lit>_>::vector(&local_108,&local_128);
        iVar11 = (int)((ulong)((long)local_108.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl
                                     .super__Vector_impl_data._M_finish -
                              (long)local_108.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                                    super__Vector_impl_data._M_start) >> 2) + 1;
        local_130._pt = (Clause *)malloc((long)iVar11 * 4 + 8);
        *(uint *)local_130._pt = (*(uint *)local_130._pt & 0xfc) + iVar11 * 0x100 + 2;
        vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),&local_130._pt);
        aVar22 = local_130;
        if ((long)local_108.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_108.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                  super__Vector_impl_data._M_start != 0) {
          lVar19 = (long)local_108.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)local_108.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                         super__Vector_impl_data._M_start >> 2;
          uVar16 = 1;
          do {
            if (*(uint *)local_130._pt >> 8 <= uVar16) goto LAB_001a5151;
            (local_130._pt)->data[uVar16].x =
                 local_108.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar16 - 1].x;
            lVar1 = (-(ulong)(lVar19 == 0) - lVar19) + uVar16;
            uVar16 = uVar16 + 1;
          } while (lVar1 != 0);
        }
        if (local_108.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0) {
          operator_delete(local_108.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        SAT::cEnqueue(&sat,(Lit)(((this->b).s ^ 1) + (this->b).v * 2),(Reason)aVar22);
        uVar16 = (ulong)(sat.confl == (Clause *)0x0);
      }
      bVar25 = (byte)uVar16;
      if ((IntElemBoundsImp<0,_4,_0> *)
          local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
          _M_start != (IntElemBoundsImp<0,_4,_0> *)0x0) {
        operator_delete(local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      bVar9 = bVar25;
      if (lVar14 < (long)uVar15) goto LAB_001a4f2c;
    }
    else {
      bVar24 = (this->a).sz != 0;
      if (bVar24) {
        uVar15 = 0;
        do {
          lVar14 = uVar15 - (long)(this->x).b;
          pIVar7 = (this->x).var;
          if ((((pIVar7->min).v <= lVar14) && (lVar14 <= (pIVar7->max).v)) &&
             ((pIVar7->vals == (Tchar *)0x0 || (pIVar7->vals[lVar14].v != '\0')))) {
            pIVar18 = (this->a).data;
            if ((((this->y).var)->max).v < ((pIVar18[uVar15].var)->min).v) {
              uVar17 = (this->b).v;
              local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)CONCAT44(local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl
                                     .super__Vector_impl_data._M_start._4_4_,
                                     (uint)((int)sat.assigns.data[uVar17] - 1U < 0xfffffffd) +
                                     uVar17 * 2);
              iVar11 = (*((pIVar18[uVar15].var)->super_Var).super_Branching._vptr_Branching[8])();
              local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)CONCAT44(iVar11,local_128.super__Vector_base<Lit,_std::allocator<Lit>_>.
                                            _M_impl.super__Vector_impl_data._M_start._0_4_);
              iVar11 = (*(((this->y).var)->super_Var).super_Branching._vptr_Branching[9])();
              local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   (pointer)CONCAT44(local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl
                                     .super__Vector_impl_data._M_finish._4_4_,iVar11);
              __l_00._M_len = 3;
              __l_00._M_array = (iterator)&local_128;
              std::vector<Lit,_std::allocator<Lit>_>::vector(&local_d8,__l_00,&local_131);
              iVar11 = (int)((ulong)((long)local_d8.super__Vector_base<Lit,_std::allocator<Lit>_>.
                                           _M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_d8.super__Vector_base<Lit,_std::allocator<Lit>_>.
                                          _M_impl.super__Vector_impl_data._M_start) >> 2) + 1;
              local_130._pt = (Clause *)malloc((long)iVar11 * 4 + 8);
              *(uint *)local_130._pt = (*(uint *)local_130._pt & 0xfc) + iVar11 * 0x100 + 2;
              vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),&local_130._pt);
              aVar22 = local_130;
              if ((long)local_d8.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_d8.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                        super__Vector_impl_data._M_start != 0) {
                lVar14 = (long)local_d8.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                         (long)local_d8.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                               super__Vector_impl_data._M_start >> 2;
                uVar16 = 1;
                do {
                  if (*(uint *)local_130._pt >> 8 <= uVar16) goto LAB_001a5151;
                  (local_130._pt)->data[uVar16].x =
                       local_d8.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar16 - 1].x;
                  lVar19 = (-(ulong)(lVar14 == 0) - lVar14) + uVar16;
                  uVar16 = uVar16 + 1;
                } while (lVar19 != 0);
              }
              if (local_d8.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_d8.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                                super__Vector_impl_data._M_start);
              }
              lVar14 = uVar15 - (long)(this->x).b;
              pIVar7 = (this->x).var;
              if (((lVar14 < (pIVar7->min).v) || ((pIVar7->max).v < lVar14)) ||
                 ((pIVar7->vals != (Tchar *)0x0 && (pIVar7->vals[lVar14].v == '\0'))))
              goto LAB_001a4347;
              if (so.lazy == false) {
                aVar22._pt = (Clause *)0x0;
              }
              iVar11 = (*(pIVar7->super_Var).super_Branching._vptr_Branching[0x11])
                                 (pIVar7,lVar14,aVar22._pt,1);
              if ((char)iVar11 != '\0') goto LAB_001a4347;
LAB_001a4f44:
              bVar25 = 0;
              bVar9 = 0;
              if (bVar24) goto LAB_001a4f2c;
              goto LAB_001a47ce;
            }
LAB_001a4347:
            pIVar18 = (this->a).data;
            if (((pIVar18[uVar15].var)->max).v < (((this->y).var)->min).v) {
              uVar17 = (this->b).v;
              local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)CONCAT44(local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl
                                     .super__Vector_impl_data._M_start._4_4_,
                                     (uint)((int)sat.assigns.data[uVar17] - 1U < 0xfffffffd) +
                                     uVar17 * 2);
              iVar11 = (*((pIVar18[uVar15].var)->super_Var).super_Branching._vptr_Branching[9])();
              local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)CONCAT44(iVar11,local_128.super__Vector_base<Lit,_std::allocator<Lit>_>.
                                            _M_impl.super__Vector_impl_data._M_start._0_4_);
              iVar11 = (*(((this->y).var)->super_Var).super_Branching._vptr_Branching[8])();
              local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   (pointer)CONCAT44(local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl
                                     .super__Vector_impl_data._M_finish._4_4_,iVar11);
              __l_01._M_len = 3;
              __l_01._M_array = (iterator)&local_128;
              std::vector<Lit,_std::allocator<Lit>_>::vector(&local_f0,__l_01,&local_131);
              iVar11 = (int)((ulong)((long)local_f0.super__Vector_base<Lit,_std::allocator<Lit>_>.
                                           _M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_f0.super__Vector_base<Lit,_std::allocator<Lit>_>.
                                          _M_impl.super__Vector_impl_data._M_start) >> 2) + 1;
              local_130._pt = (Clause *)malloc((long)iVar11 * 4 + 8);
              *(uint *)local_130._pt = (*(uint *)local_130._pt & 0xfc) + iVar11 * 0x100 + 2;
              vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),&local_130._pt);
              aVar22 = local_130;
              if ((long)local_f0.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_f0.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                        super__Vector_impl_data._M_start != 0) {
                lVar14 = (long)local_f0.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                         (long)local_f0.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                               super__Vector_impl_data._M_start >> 2;
                uVar16 = 1;
                do {
                  if (*(uint *)local_130._pt >> 8 <= uVar16) goto LAB_001a5151;
                  (local_130._pt)->data[uVar16].x =
                       local_f0.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar16 - 1].x;
                  lVar19 = (-(ulong)(lVar14 == 0) - lVar14) + uVar16;
                  uVar16 = uVar16 + 1;
                } while (lVar19 != 0);
              }
              if (local_f0.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_f0.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                                super__Vector_impl_data._M_start);
              }
              lVar14 = uVar15 - (long)(this->x).b;
              pIVar7 = (this->x).var;
              if ((((pIVar7->min).v <= lVar14) && (lVar14 <= (pIVar7->max).v)) &&
                 ((pIVar7->vals == (Tchar *)0x0 || (pIVar7->vals[lVar14].v != '\0')))) {
                if (so.lazy == false) {
                  aVar22._pt = (Clause *)0x0;
                }
                iVar11 = (*(pIVar7->super_Var).super_Branching._vptr_Branching[0x11])
                                   (pIVar7,lVar14,aVar22._pt,1);
                if ((char)iVar11 == '\0') goto LAB_001a4f44;
              }
            }
          }
          uVar15 = uVar15 + 1;
          bVar24 = uVar15 < (this->a).sz;
        } while (bVar24);
      }
      bVar9 = 0;
    }
LAB_001a47ce:
    bVar25 = bVar9;
    if (this->no_min_support == true) {
      local_130._a = 0x7fffffffffffffff;
      uVar15 = (ulong)(this->a).sz;
      if (uVar15 == 0) {
        iVar11 = -1;
      }
      else {
        aVar22._a = 0x7fffffffffffffff;
        pIVar7 = (this->x).var;
        pIVar18 = (this->a).data;
        lVar14 = -(long)(this->x).b;
        uVar21 = 0xffffffff;
        uVar16 = 0;
        do {
          if ((((pIVar7->min).v <= lVar14) && (lVar14 <= (pIVar7->max).v)) &&
             ((pIVar7->vals == (Tchar *)0x0 || (pIVar7->vals[lVar14].v != '\0')))) {
            iVar10 = (pIVar18->var->min).v;
            aVar23 = (anon_union_8_2_743a5d44_for_Reason_0)(long)iVar10;
            bVar24 = (long)aVar23._pt < (long)aVar22._pt;
            if (bVar24) {
              uVar21 = uVar16 & 0xffffffff;
              aVar22 = aVar23;
              local_130 = aVar23;
            }
            iVar11 = (int)uVar21;
            if (bVar24 && iVar10 <= (((this->y).var)->min).v) break;
          }
          iVar11 = (int)uVar21;
          uVar16 = uVar16 + 1;
          lVar14 = lVar14 + 1;
          pIVar18 = pIVar18 + 1;
        } while (uVar15 != uVar16);
      }
      local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)&this->min_support;
      local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)CONCAT44(4,(this->min_support).v);
      vec<TrailElem>::push(&engine.trail,(TrailElem *)&local_128);
      (this->min_support).v = iVar11;
      pIVar7 = (this->y).var;
      if ((long)(pIVar7->min).v < (long)local_130) {
        local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)&local_130;
        if (sat.assigns.data[(uint)(this->b).v] == '\0') {
          bVar9 = 1;
          if ((long)(pIVar7->max).v < (long)local_130._pt) {
            local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
            _M_start = (pointer)this;
            RVar12.field_0 =
                 (anon_union_8_2_743a5d44_for_Reason_0)
                 propagate::anon_class_16_2_f8370e7b::operator()
                           ((anon_class_16_2_f8370e7b *)&local_128);
            iVar11 = (*(((this->y).var)->super_Var).super_Branching._vptr_Branching[9])();
            if (*(uint *)RVar12.field_0 < 0x200) goto LAB_001a5151;
            *(int *)((long)RVar12.field_0 + 8) = iVar11;
            SAT::cEnqueue(&sat,(Lit)(((this->b).s ^ 1) + (this->b).v * 2),RVar12);
            bVar25 = sat.confl == (Clause *)0x0;
            bVar9 = 0;
          }
        }
        else {
          local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)this;
          pCVar13 = propagate::anon_class_16_2_f8370e7b::operator()
                              ((anon_class_16_2_f8370e7b *)&local_128);
          if (*(uint *)pCVar13 < 0x200) goto LAB_001a5151;
          uVar17 = (this->b).v;
          *(uint *)(pCVar13 + 1) =
               (uint)((int)sat.assigns.data[uVar17] - 1U < 0xfffffffd) + uVar17 * 2;
          pIVar7 = (this->y).var;
          iVar11 = (*(pIVar7->super_Var).super_Branching._vptr_Branching[0xe])
                             (pIVar7,local_130._pt,pCVar13,1);
          bVar9 = (byte)iVar11;
          bVar25 = bVar25 & bVar9;
        }
        if (bVar9 != 0) goto LAB_001a4bd5;
        bVar24 = false;
      }
      else {
LAB_001a4bd5:
        this->no_min_support = false;
        bVar24 = true;
      }
      if (!bVar24) goto LAB_001a4f2c;
    }
    if (this->no_max_support == true) {
      uVar15 = (ulong)(this->a).sz;
      if (uVar15 == 0) {
        iVar11 = -1;
        local_130._a = 0xffffffff80000000;
      }
      else {
        pIVar7 = (this->x).var;
        lVar14 = -(long)(this->x).b;
        iVar11 = -1;
        lVar19 = 0;
        iVar10 = 0;
        aVar22._a = 0xffffffff80000000;
        do {
          local_130 = aVar22;
          if ((((pIVar7->min).v <= lVar14) && (lVar14 <= (pIVar7->max).v)) &&
             ((pIVar7->vals == (Tchar *)0x0 || (pIVar7->vals[lVar14].v != '\0')))) {
            iVar5 = *(int *)(*(long *)((long)&((this->a).data)->var + lVar19) + 0x10);
            aVar23 = (anon_union_8_2_743a5d44_for_Reason_0)(long)iVar5;
            if ((long)aVar22._pt <= (long)aVar23._pt) {
              local_130 = aVar23;
            }
            if (((long)aVar22._pt < (long)aVar23._pt) &&
               (iVar11 = iVar10, (((this->y).var)->max).v <= iVar5)) break;
          }
          iVar10 = iVar10 + 1;
          lVar14 = lVar14 + 1;
          lVar19 = lVar19 + 0x10;
          aVar22 = local_130;
        } while (uVar15 << 4 != lVar19);
      }
      local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)&this->max_support;
      local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)CONCAT44(4,(this->max_support).v);
      vec<TrailElem>::push(&engine.trail,(TrailElem *)&local_128);
      (this->max_support).v = iVar11;
      pIVar7 = (this->y).var;
      if ((long)local_130 < (long)(pIVar7->max).v) {
        local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)&local_130;
        if (sat.assigns.data[(uint)(this->b).v] == '\0') {
          bVar9 = 1;
          if ((long)local_130._pt < (long)(pIVar7->min).v) {
            local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
            _M_start = (pointer)this;
            RVar12.field_0 =
                 (anon_union_8_2_743a5d44_for_Reason_0)
                 propagate::anon_class_16_2_f8370e7b::operator()
                           ((anon_class_16_2_f8370e7b *)&local_128);
            iVar11 = (*(((this->y).var)->super_Var).super_Branching._vptr_Branching[8])();
            if (*(uint *)RVar12.field_0 < 0x200) goto LAB_001a5151;
            *(int *)((long)RVar12.field_0 + 8) = iVar11;
            SAT::cEnqueue(&sat,(Lit)(((this->b).s ^ 1) + (this->b).v * 2),RVar12);
            bVar25 = sat.confl == (Clause *)0x0;
            bVar9 = 0;
          }
        }
        else {
          local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)this;
          pCVar13 = propagate::anon_class_16_2_f8370e7b::operator()
                              ((anon_class_16_2_f8370e7b *)&local_128);
          if (*(uint *)pCVar13 < 0x200) {
LAB_001a5151:
            abort();
          }
          uVar17 = (this->b).v;
          *(uint *)(pCVar13 + 1) =
               (uint)((int)sat.assigns.data[uVar17] - 1U < 0xfffffffd) + uVar17 * 2;
          pIVar7 = (this->y).var;
          iVar11 = (*(pIVar7->super_Var).super_Branching._vptr_Branching[0xf])
                             (pIVar7,local_130._pt,pCVar13,1);
          bVar9 = (byte)iVar11;
          bVar25 = bVar25 & bVar9;
        }
        if (bVar9 != 0) goto LAB_001a4f1b;
        bVar24 = false;
      }
      else {
LAB_001a4f1b:
        this->no_max_support = false;
        bVar24 = true;
      }
      if (!bVar24) goto LAB_001a4f2c;
    }
  }
  else {
    local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)&(this->super_Propagator).satisfied;
    local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)CONCAT44(1,(int)(this->super_Propagator).satisfied.v);
    vec<TrailElem>::push(&engine.trail,(TrailElem *)&local_128);
    (this->super_Propagator).satisfied.v = '\x01';
  }
  bVar25 = 1;
LAB_001a4f2c:
  return (bool)(bVar25 & 1);
}

Assistant:

bool propagate() override {
		if (b.isFixed() && b.isFalse()) {
			satisfied = true;
			return true;
		}

		// x is out of bounds
		if ((is_fixed != 0) && (fixed_index < 0 || fixed_index >= static_cast<int>(a.size()))) {
			return b.setVal(false, x.getValLit());
		}

		// y = a[fixed_index]
		if (is_fixed != 0) {
			assert(x.getVal() == fixed_index);
			const IntView<W>& f = a[fixed_index];
			if (b.isFixed()) {
				setDom(y, setMin, f.getMin(), Reason_new({b.getValLit(), f.getMinLit(), x.getValLit()}));
				setDom(f, setMin, y.getMin(), Reason_new({b.getValLit(), y.getMinLit(), x.getValLit()}));
				setDom(y, setMax, f.getMax(), Reason_new({b.getValLit(), f.getMaxLit(), x.getValLit()}));
				setDom(f, setMax, y.getMax(), Reason_new({b.getValLit(), y.getMaxLit(), x.getValLit()}));
				if (y.isFixed() && f.isFixed()) {
					satisfied = true;
				}
			} else if (f.getMin() > y.getMax()) {
				Clause* r = Reason_new({x.getValLit(), f.getMinLit(), y.getMaxLit()});
				return b.setVal(false, r);
			} else if (f.getMax() < y.getMin()) {
				Clause* r = Reason_new({x.getValLit(), f.getMaxLit(), y.getMinLit()});
				return b.setVal(false, r);
			}
			return true;
		}

		if (b.isFixed()) {
			for (unsigned int i = 0; i < a.size(); i++) {
				if (!x.indomain(i)) {
					continue;
				}
				if (y.getMax() < a[i].getMin()) {
					Clause* r = Reason_new({b.getValLit(), a[i].getMinLit(), y.getMaxLit()});
					setDom(x, remVal, i, r);
				}
				if (y.getMin() > a[i].getMax()) {
					Clause* r = Reason_new({b.getValLit(), a[i].getMaxLit(), y.getMinLit()});
					setDom(x, remVal, i, r);
				}
			}
		} else {
			std::vector<Lit> expl;
			bool push_min = false;
			bool push_max = false;
			unsigned int i = 0;
			while (i <= a.size()) {
				if (!x.indomain(i)) {
					expl.push_back(x.getLit(i, LR_EQ));
				} else if (y.getMax() < a[i].getMin()) {
					if (!push_max) {
						expl.push_back(y.getMaxLit());
						push_max = true;
					}
					expl.push_back(a[i].getMinLit());
				} else if (y.getMin() > a[i].getMax()) {
					if (!push_min) {
						expl.push_back(y.getMinLit());
						push_min = true;
					}
					expl.push_back(a[i].getMaxLit());
				} else {
					break;
				}
				i++;
			}
			if (i > x.getMax()) {
				Clause* r = Reason_new(expl);
				return b.setVal(false, r);
			}
		}

		if (no_min_support) {
			const int64_t old_m = y.getMin();
			int64_t new_m = INT64_MAX;
			int best = -1;
			for (unsigned int i = 0; i < a.size(); i++) {
				if (!x.indomain(i)) {
					continue;
				}
				const int64_t cur_m = a[i].getMin();
				if (cur_m < new_m) {
					best = i;
					new_m = cur_m;
					if (cur_m <= old_m) {
						break;
					}
				}
			}
			min_support = best;
			if (y.setMinNotR(new_m)) {
				auto reason = [&] {
					Clause* r = nullptr;
					if (so.lazy) {
						r = Reason_new(a.size() + 2);
						// Finesse lower bounds
						for (unsigned int i = 0; i < a.size(); i++) {
							(*r)[i + 2] = x.indomain(i) ? a[i].getFMinLit(new_m) : x.getLit(i, LR_EQ);
						}
					}
					return r;
				};
				if (b.isFixed()) {
					Clause* r = reason();
					(*r)[1] = b.getValLit();
					if (!y.setMin(new_m, r)) {
						return false;
					}
				} else if (y.getMax() < new_m) {
					Clause* r = reason();
					(*r)[1] = y.getMaxLit();
					return b.setVal(false, r);
				}
			}
			no_min_support = false;
		}

		if (no_max_support) {
			const int64_t old_m = y.getMax();
			int64_t new_m = INT_MIN;
			int best = -1;
			for (unsigned int i = 0; i < a.size(); i++) {
				if (!x.indomain(i)) {
					continue;
				}
				const int64_t cur_m = a[i].getMax();
				if (cur_m > new_m) {
					best = i;
					new_m = cur_m;
					if (cur_m >= old_m) {
						break;
					}
				}
			}
			max_support = best;
			if (y.setMaxNotR(new_m)) {
				auto reason = [&] {
					Clause* r = nullptr;
					if (so.lazy) {
						r = Reason_new(a.size() + 2);
						// Finesse upper bounds
						for (unsigned int i = 0; i < a.size(); i++) {
							(*r)[i + 2] = x.indomain(i) ? a[i].getFMaxLit(new_m) : x.getLit(i, LR_EQ);
						}
					}
					return r;
				};
				if (b.isFixed()) {
					Clause* r = reason();
					(*r)[1] = b.getValLit();
					if (!y.setMax(new_m, r)) {
						return false;
					}
				} else if (y.getMin() > new_m) {
					Clause* r = reason();
					(*r)[1] = y.getMinLit();
					return b.setVal(false, r);
				}
			}
			no_max_support = false;
		}

		return true;
	}